

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_int_noinline<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,
          write_int_arg<unsigned___int128> arg,basic_format_specs<char32_t> *specs,locale_ref loc)

{
  size_t sVar1;
  ulong uVar2;
  undefined1 value [16];
  undefined1 n [16];
  undefined1 value_00 [16];
  uint uVar3;
  int iVar4;
  char *digits;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar5;
  uint *puVar6;
  char *pcVar7;
  byte *pbVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  char *digits_1;
  int *piVar13;
  char *pcVar14;
  detail *pdVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  buffer<char32_t> *buf;
  bool bVar19;
  bool bVar20;
  format_decimal_result<char32_t_*> fVar21;
  undefined1 in_stack_ffffffffffffff08;
  undefined1 uVar22;
  presentation_type pVar23;
  undefined7 in_stack_ffffffffffffff09;
  undefined7 uVar24;
  write_int_data<char32_t> local_e8;
  undefined1 local_d8 [40];
  ulong local_b0;
  int local_a8;
  bool local_a4;
  
  pVar23 = specs->type;
  uVar22 = SUB81(specs,0);
  uVar24 = (undefined7)((ulong)specs >> 8);
  switch(pVar23) {
  case none:
  case dec:
    if (((specs->field_0xa & 1) != 0) &&
       (value._1_7_ = in_stack_ffffffffffffff09, value[0] = in_stack_ffffffffffffff08,
       value._8_8_ = out.container,
       bVar19 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128,char32_t>
                          ((detail *)&stack0xffffffffffffff10,
                           (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> *)
                           (detail *)arg.abs_value,(unsigned___int128)value,arg.abs_value._8_4_,
                           (basic_format_specs<char32_t> *)(ulong)arg.prefix,(locale_ref)specs),
       bVar19)) {
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out.container;
    }
    n._1_7_ = in_stack_ffffffffffffff09;
    n[0] = in_stack_ffffffffffffff08;
    n._8_8_ = out.container;
    iVar4 = count_digits_fallback<unsigned__int128>((detail *)arg.abs_value,(unsigned___int128)n);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char32_t>::write_int_data(&local_e8,iVar4,arg.prefix,specs);
      local_d8._0_4_ = arg.prefix;
      local_d8._8_8_ = local_e8.size;
      local_d8._16_8_ = local_e8.padding;
      local_b0 = arg.abs_value._8_8_;
      local_d8._32_8_ = (detail *)arg.abs_value;
      local_a8 = iVar4;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                        (out,(basic_format_specs<char32_t> *)CONCAT71(uVar24,uVar22),local_e8.size,
                         local_e8.size,(anon_class_64_3_4ecd7a16 *)local_d8);
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
    }
    if (-1 < iVar4) {
      bVar5.container = out.container;
      if ((arg.prefix != 0) &&
         (((undefined1  [32])arg & (undefined1  [32])0xffffff) != (undefined1  [32])0x0)) {
        uVar10 = (out.container)->size_;
        uVar12 = arg.prefix & 0xffffff;
        do {
          uVar2 = uVar10 + 1;
          uVar11 = uVar10;
          uVar10 = uVar2;
          if ((out.container)->capacity_ < uVar2) {
            (**(out.container)->_vptr_buffer)(out.container);
            uVar11 = (out.container)->size_;
            uVar10 = uVar11 + 1;
          }
          (out.container)->size_ = uVar10;
          (out.container)->ptr_[uVar11] = uVar12 & 0xff;
          bVar19 = 0xff < uVar12;
          uVar12 = uVar12 >> 8;
        } while (bVar19);
      }
      value_00._1_7_ = in_stack_ffffffffffffff09;
      value_00[0] = in_stack_ffffffffffffff08;
      value_00._8_8_ = bVar5.container;
      fVar21 = format_decimal<char32_t,unsigned__int128>
                         ((detail *)local_d8,(char32_t *)(detail *)arg.abs_value,
                          (unsigned___int128)value_00,arg.abs_value._8_4_);
      bVar5 = copy_str_noinline<char32_t,char32_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                        ((char32_t *)local_d8,fVar21.end,out);
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
    }
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  case oct:
    lVar16 = -4;
    uVar10 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    lVar17 = 0;
    do {
      lVar18 = lVar17;
      uVar2 = uVar10 << 0x3d;
      lVar16 = lVar16 + 4;
      lVar17 = lVar18 + 1;
      bVar19 = (detail *)0x7 < pdVar15;
      bVar20 = uVar10 != 0;
      uVar11 = -uVar10;
      uVar10 = uVar10 >> 3;
      pdVar15 = (detail *)(uVar2 | (ulong)pdVar15 >> 3);
    } while (bVar20 || uVar11 < bVar19);
    iVar4 = (int)lVar17;
    if (((specs->field_0x9 & 0x80) != 0) &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) &&
        specs->precision <= iVar4)) {
      uVar12 = 0x3000;
      if (arg.prefix == 0) {
        uVar12 = 0x30;
      }
      arg.prefix = (uVar12 | arg.prefix) + L'\x01000000';
    }
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char32_t>::write_int_data(&local_e8,iVar4,arg.prefix,specs);
      local_d8._8_8_ = local_e8.size;
      local_d8._16_8_ = local_e8.padding;
      local_b0 = arg.abs_value._8_8_;
      local_d8._32_8_ = (detail *)arg.abs_value;
      local_d8._0_4_ = arg.prefix;
      local_a8 = iVar4;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                        (out,specs,local_e8.size,local_e8.size,(anon_class_64_3_4ecd7a16 *)local_d8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
    }
    if ((arg.prefix != L'\0') && ((arg.prefix & 0xffffff) != 0)) {
      uVar10 = (out.container)->size_;
      uVar12 = arg.prefix & 0xffffff;
      do {
        uVar2 = uVar10 + 1;
        uVar11 = uVar10;
        uVar10 = uVar2;
        if ((out.container)->capacity_ < uVar2) {
          (**(out.container)->_vptr_buffer)(out.container);
          uVar11 = (out.container)->size_;
          uVar10 = uVar11 + 1;
        }
        (out.container)->size_ = uVar10;
        (out.container)->ptr_[uVar11] = uVar12 & 0xff;
        bVar19 = 0xff < uVar12;
        uVar12 = uVar12 >> 8;
      } while (bVar19);
    }
    sVar1 = (out.container)->size_;
    uVar10 = sVar1 + lVar17;
    if (uVar10 <= (out.container)->capacity_) {
      (out.container)->size_ = uVar10;
      if ((out.container)->ptr_ != (char32_t *)0x0) {
        puVar6 = (uint *)((long)(out.container)->ptr_ + lVar16 + sVar1 * 4);
        do {
          uVar10 = arg.abs_value._8_8_ << 0x3d;
          *puVar6 = (uint)(detail *)arg.abs_value & 7 | 0x30;
          puVar6 = puVar6 + -1;
          bVar19 = ((detail *)arg.abs_value < (detail *)0x8) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
          arg.abs_value._0_8_ = (detail *)(uVar10 | (ulong)(detail *)arg.abs_value >> 3);
        } while (bVar19);
        return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out.container;
      }
    }
    pbVar8 = local_d8 + lVar18;
    pcVar7 = local_d8 + lVar18 + 1;
    do {
      *pbVar8 = (byte)(detail *)arg.abs_value & 7 | 0x30;
      uVar10 = arg.abs_value._8_8_ << 0x3d;
      pbVar8 = pbVar8 + -1;
      bVar19 = (detail *)0x7 < (detail *)arg.abs_value;
      bVar20 = arg.abs_value._8_8_ != 0;
      uVar2 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
      arg.abs_value._0_8_ = (detail *)(uVar10 | (ulong)(detail *)arg.abs_value >> 3);
    } while (bVar20 || uVar2 < bVar19);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar3 = (uint)(pVar23 != hex_upper) << 0xd | 0x5830;
      uVar12 = uVar3 << 8;
      if (arg.prefix == 0) {
        uVar12 = uVar3;
      }
      arg.prefix = (uVar12 | arg.prefix) + L'\x02000000';
    }
    lVar16 = -4;
    uVar10 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    lVar17 = 0;
    do {
      lVar18 = lVar17;
      uVar2 = uVar10 << 0x3c;
      lVar16 = lVar16 + 4;
      lVar17 = lVar18 + 1;
      bVar19 = (detail *)0xf < pdVar15;
      bVar20 = uVar10 != 0;
      uVar11 = -uVar10;
      uVar10 = uVar10 >> 4;
      pdVar15 = (detail *)(uVar2 | (ulong)pdVar15 >> 4);
    } while (bVar20 || uVar11 < bVar19);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char32_t>::write_int_data(&local_e8,(int)lVar17,arg.prefix,specs);
      local_d8._8_8_ = local_e8.size;
      local_d8._16_8_ = local_e8.padding;
      local_b0 = arg.abs_value._8_8_;
      local_d8._32_8_ = (detail *)arg.abs_value;
      local_d8._0_4_ = arg.prefix;
      local_a8 = (int)lVar17;
      local_a4 = pVar23 == hex_upper;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                        (out,(basic_format_specs<char32_t> *)CONCAT71(uVar24,uVar22),local_e8.size,
                         local_e8.size,(anon_class_64_3_4ecd7a16 *)local_d8);
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
    }
    if ((arg.prefix != L'\0') && ((arg.prefix & 0xffffff) != 0)) {
      uVar10 = (out.container)->size_;
      uVar12 = arg.prefix & 0xffffff;
      do {
        uVar2 = uVar10 + 1;
        uVar11 = uVar10;
        uVar10 = uVar2;
        if ((out.container)->capacity_ < uVar2) {
          (**(out.container)->_vptr_buffer)(out.container);
          uVar11 = (out.container)->size_;
          uVar10 = uVar11 + 1;
        }
        (out.container)->size_ = uVar10;
        (out.container)->ptr_[uVar11] = uVar12 & 0xff;
        bVar19 = 0xff < uVar12;
        uVar12 = uVar12 >> 8;
      } while (bVar19);
    }
    sVar1 = (out.container)->size_;
    uVar10 = sVar1 + lVar17;
    if (uVar10 <= (out.container)->capacity_) {
      (out.container)->size_ = uVar10;
      if ((out.container)->ptr_ != (char32_t *)0x0) {
        pcVar7 = "0123456789abcdef";
        if (pVar23 == hex_upper) {
          pcVar7 = "0123456789ABCDEF";
        }
        piVar13 = (int *)((long)(out.container)->ptr_ + lVar16 + sVar1 * 4);
        do {
          uVar10 = arg.abs_value._8_8_ << 0x3c;
          *piVar13 = (int)pcVar7[(uint)(detail *)arg.abs_value & 0xf];
          piVar13 = piVar13 + -1;
          bVar19 = ((detail *)arg.abs_value < (detail *)0x10) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
          arg.abs_value._0_8_ = (detail *)(uVar10 | (ulong)(detail *)arg.abs_value >> 4);
        } while (bVar19);
        return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out.container;
      }
    }
    pcVar9 = local_d8 + lVar18;
    pcVar7 = local_d8 + lVar18 + 1;
    pcVar14 = "0123456789abcdef";
    if (pVar23 == hex_upper) {
      pcVar14 = "0123456789ABCDEF";
    }
    do {
      *pcVar9 = pcVar14[(uint)(detail *)arg.abs_value & 0xf];
      pcVar9 = pcVar9 + -1;
      bVar19 = (detail *)0xf < (detail *)arg.abs_value;
      bVar20 = arg.abs_value._8_8_ != 0;
      uVar10 = -arg.abs_value._8_8_;
      arg.abs_value._0_8_ =
           (detail *)(arg.abs_value._8_8_ << 0x3c | (ulong)(detail *)arg.abs_value >> 4);
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
    } while (bVar20 || uVar10 < bVar19);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar3 = (uint)(pVar23 != bin_upper) << 0xd | 0x4230;
      uVar12 = uVar3 << 8;
      if (arg.prefix == 0) {
        uVar12 = uVar3;
      }
      arg.prefix = (uVar12 | arg.prefix) + L'\x02000000';
    }
    lVar16 = -4;
    uVar10 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    lVar17 = 0;
    do {
      lVar18 = lVar17;
      uVar2 = uVar10 << 0x3f;
      lVar16 = lVar16 + 4;
      lVar17 = lVar18 + 1;
      bVar19 = (detail *)0x1 < pdVar15;
      bVar20 = uVar10 != 0;
      uVar11 = -uVar10;
      uVar10 = uVar10 >> 1;
      pdVar15 = (detail *)(uVar2 | (ulong)pdVar15 >> 1);
    } while (bVar20 || uVar11 < bVar19);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char32_t>::write_int_data(&local_e8,(int)lVar17,arg.prefix,specs);
      local_d8._8_8_ = local_e8.size;
      local_d8._16_8_ = local_e8.padding;
      local_b0 = arg.abs_value._8_8_;
      local_d8._32_8_ = (detail *)arg.abs_value;
      local_d8._0_4_ = arg.prefix;
      local_a8 = (int)lVar17;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                        (out,specs,local_e8.size,local_e8.size,(anon_class_64_3_4ecd7a16 *)local_d8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
    }
    if ((arg.prefix != L'\0') && ((arg.prefix & 0xffffff) != 0)) {
      uVar10 = (out.container)->size_;
      uVar12 = arg.prefix & 0xffffff;
      do {
        uVar2 = uVar10 + 1;
        uVar11 = uVar10;
        uVar10 = uVar2;
        if ((out.container)->capacity_ < uVar2) {
          (**(out.container)->_vptr_buffer)(out.container);
          uVar11 = (out.container)->size_;
          uVar10 = uVar11 + 1;
        }
        (out.container)->size_ = uVar10;
        (out.container)->ptr_[uVar11] = uVar12 & 0xff;
        bVar19 = 0xff < uVar12;
        uVar12 = uVar12 >> 8;
      } while (bVar19);
    }
    sVar1 = (out.container)->size_;
    uVar10 = sVar1 + lVar17;
    if (uVar10 <= (out.container)->capacity_) {
      (out.container)->size_ = uVar10;
      if ((out.container)->ptr_ != (char32_t *)0x0) {
        puVar6 = (uint *)((long)(out.container)->ptr_ + lVar16 + sVar1 * 4);
        do {
          uVar10 = arg.abs_value._8_8_ << 0x3f;
          *puVar6 = (uint)(detail *)arg.abs_value & 1 | 0x30;
          puVar6 = puVar6 + -1;
          bVar19 = ((detail *)arg.abs_value < (detail *)0x2) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
          arg.abs_value._0_8_ = (detail *)(uVar10 | (ulong)(detail *)arg.abs_value >> 1);
        } while (bVar19);
        return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out.container;
      }
    }
    pbVar8 = local_d8 + lVar18;
    pcVar7 = local_d8 + lVar18 + 1;
    do {
      *pbVar8 = (byte)(detail *)arg.abs_value & 1 | 0x30;
      uVar10 = arg.abs_value._8_8_ << 0x3f;
      pbVar8 = pbVar8 + -1;
      bVar19 = (detail *)0x1 < (detail *)arg.abs_value;
      bVar20 = arg.abs_value._8_8_ != 0;
      uVar2 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
      arg.abs_value._0_8_ = (detail *)(uVar10 | (ulong)(detail *)arg.abs_value >> 1);
    } while (bVar20 || uVar2 < bVar19);
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
  case chr:
    local_d8._0_4_ = (undefined4)arg.abs_value;
    bVar5 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_char<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::basic_format_specs<char32_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                      (out,specs,1,1,(anon_class_4_1_a8c68091 *)local_d8);
    return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
  }
  bVar5 = copy_str_noinline<char32_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                    (local_d8,pcVar7,out);
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}